

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O0

string * __thiscall GraphPropagator::available_to_dot_abi_cxx11_(GraphPropagator *this,int *arr)

{
  bool bVar1;
  undefined1 uVar2;
  int iVar3;
  string *in_RDI;
  int e;
  int n;
  string *res;
  int in_stack_fffffffffffffdcc;
  undefined7 in_stack_fffffffffffffdd0;
  undefined1 in_stack_fffffffffffffdd7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe00;
  undefined7 in_stack_fffffffffffffe08;
  int in_stack_fffffffffffffe1c;
  int iVar4;
  string local_198 [32];
  string local_178 [32];
  string local_158 [32];
  string local_138 [32];
  string local_118 [32];
  string local_f8 [32];
  string local_d8 [32];
  string local_b8 [36];
  int local_94;
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  int local_30;
  allocator local_1a;
  undefined1 local_19;
  
  local_19 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)in_RDI,"graph {\n",&local_1a);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a);
  for (local_30 = 0; iVar4 = local_30, iVar3 = nbNodes((GraphPropagator *)0x2aa7fd), iVar4 < iVar3;
      local_30 = local_30 + 1) {
    getNodeVar((GraphPropagator *)CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0),
               in_stack_fffffffffffffdcc);
    bVar1 = BoolView::isFixed((BoolView *)0x2aa838);
    if (bVar1) {
      getNodeVar((GraphPropagator *)CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0),
                 in_stack_fffffffffffffdcc);
      bVar1 = BoolView::isTrue((BoolView *)
                               CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0));
      if (bVar1) {
        std::__cxx11::to_string(in_stack_fffffffffffffe1c);
        std::operator+((char *)in_stack_fffffffffffffdd8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0));
        std::operator+(in_stack_fffffffffffffdd8,
                       (char *)CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0));
        std::__cxx11::string::operator+=((string *)in_RDI,local_50);
        std::__cxx11::string::~string(local_50);
        std::__cxx11::string::~string(local_70);
        std::__cxx11::string::~string(local_90);
      }
    }
  }
  local_94 = 0;
  do {
    iVar4 = local_94;
    iVar3 = nbEdges((GraphPropagator *)0x2aa9fe);
    if (iVar3 <= iVar4) {
      std::__cxx11::string::operator+=((string *)in_RDI,"}");
      return in_RDI;
    }
    getEdgeVar((GraphPropagator *)CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0),
               in_stack_fffffffffffffdcc);
    uVar2 = BoolView::isFixed((BoolView *)0x2aaa39);
    if ((bool)uVar2) {
      in_stack_fffffffffffffe00 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           getEdgeVar((GraphPropagator *)
                      CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0),
                      in_stack_fffffffffffffdcc);
      bVar1 = BoolView::isTrue((BoolView *)
                               CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0));
      if (bVar1) goto LAB_002aaa81;
    }
    else {
LAB_002aaa81:
      getTail((GraphPropagator *)CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0),
              in_stack_fffffffffffffdcc);
      std::__cxx11::to_string(iVar4);
      std::operator+((char *)in_stack_fffffffffffffdd8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0));
      std::operator+(in_stack_fffffffffffffdd8,
                     (char *)CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0));
      getHead((GraphPropagator *)CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0),
              in_stack_fffffffffffffdcc);
      std::__cxx11::to_string(iVar4);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(uVar2,in_stack_fffffffffffffe08),in_stack_fffffffffffffe00);
      std::__cxx11::string::operator+=((string *)in_RDI,local_b8);
      std::__cxx11::string::~string(local_b8);
      std::__cxx11::string::~string(local_138);
      std::__cxx11::string::~string(local_d8);
      std::__cxx11::string::~string(local_f8);
      std::__cxx11::string::~string(local_118);
      getEdgeVar((GraphPropagator *)CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0),
                 in_stack_fffffffffffffdcc);
      bVar1 = BoolView::isFixed((BoolView *)0x2aabb3);
      if (bVar1) {
        in_stack_fffffffffffffdd8 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             getEdgeVar((GraphPropagator *)
                        CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0),
                        in_stack_fffffffffffffdcc);
        in_stack_fffffffffffffdd7 =
             BoolView::isTrue((BoolView *)
                              CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0));
        if ((bool)in_stack_fffffffffffffdd7) {
          std::__cxx11::string::operator+=((string *)in_RDI," [color = red] ");
        }
      }
      std::__cxx11::to_string(iVar4);
      std::operator+((char *)in_stack_fffffffffffffdd8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0));
      std::operator+(in_stack_fffffffffffffdd8,
                     (char *)CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0));
      std::__cxx11::string::operator+=((string *)in_RDI,local_158);
      std::__cxx11::string::~string(local_158);
      std::__cxx11::string::~string(local_178);
      std::__cxx11::string::~string(local_198);
      std::__cxx11::string::operator+=((string *)in_RDI,";\n");
    }
    local_94 = local_94 + 1;
  } while( true );
}

Assistant:

std::string GraphPropagator::available_to_dot(int* arr) {
	std::string res = "graph {\n";
	for (int n = 0; n < nbNodes(); n++) {
		if (getNodeVar(n).isFixed() && getNodeVar(n).isTrue()) {
			res += " " + std::to_string(n) + " [color = red];\n";
		}
	}
	for (int e = 0; e < nbEdges(); e++) {
		if (!getEdgeVar(e).isFixed() || getEdgeVar(e).isTrue()) {
			res += " " + std::to_string(getTail(e)) + " -- " + std::to_string(getHead(e));
			if (getEdgeVar(e).isFixed() && getEdgeVar(e).isTrue()) {
				res += " [color = red] ";
			}
			res += "[label = \"" + std::to_string(arr[e]) + "\"]";
			res += ";\n";
		}
	}
	res += "}";

	return res;
}